

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QSettingsIniKey>::copyAppend
          (QGenericArrayOps<QSettingsIniKey> *this,QSettingsIniKey *b,QSettingsIniKey *e)

{
  QSettingsIniKey *pQVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QSettingsIniKey>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QSettingsIniKey>).size;
    do {
      pDVar2 = (b->super_QString).d.d;
      pQVar1[lVar4].super_QString.d.d = pDVar2;
      pQVar1[lVar4].super_QString.d.ptr = (b->super_QString).d.ptr;
      pQVar1[lVar4].super_QString.d.size = (b->super_QString).d.size;
      lVar3 = lVar4;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<QSettingsIniKey>).size;
      }
      pQVar1[lVar4].position = b->position;
      b = b + 1;
      lVar4 = lVar3 + 1;
      (this->super_QArrayDataPointer<QSettingsIniKey>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }